

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

ZSTD_frameProgression *
ZSTDMT_getFrameProgression(ZSTD_frameProgression *__return_storage_ptr__,ZSTDMT_CCtx *mtctx)

{
  ZSTDMT_jobDescription *pZVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  unsigned_long_long uVar7;
  ZSTDMT_jobDescription *pZVar8;
  unsigned_long_long uVar9;
  uint uVar10;
  unsigned_long_long uVar11;
  uint local_68;
  unsigned_long_long local_60;
  
  uVar11 = mtctx->consumed;
  local_60 = (mtctx->inBuff).filled + uVar11;
  uVar7 = mtctx->produced;
  uVar5 = mtctx->nextJobID;
  __return_storage_ptr__->currentJobID = uVar5;
  if (1 < mtctx->jobReady) {
    __assert_fail("mtctx->jobReady <= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x892b,"ZSTD_frameProgression ZSTDMT_getFrameProgression(ZSTDMT_CCtx *)");
  }
  uVar5 = mtctx->jobReady + uVar5;
  uVar10 = mtctx->doneJobID;
  uVar9 = uVar7;
  if (uVar10 < uVar5) {
    local_68 = 0;
    do {
      uVar4 = mtctx->jobIDMask & uVar10;
      pZVar1 = mtctx->jobs;
      pZVar8 = pZVar1 + uVar4;
      pthread_mutex_lock((pthread_mutex_t *)&pZVar1[uVar4].job_mutex);
      uVar2 = pZVar1[uVar4].cSize;
      uVar6 = 0;
      uVar3 = 0;
      if ((uVar2 < 0xffffffffffffff89) && (uVar6 = pZVar8->dstFlushed, uVar3 = uVar2, uVar2 < uVar6)
         ) {
        __return_storage_ptr__->ingested = local_60;
        __return_storage_ptr__->consumed = uVar11;
        __return_storage_ptr__->produced = uVar9;
        __return_storage_ptr__->flushed = uVar7;
        __return_storage_ptr__->nbActiveWorkers = local_68;
        __assert_fail("flushed <= produced",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8935,"ZSTD_frameProgression ZSTDMT_getFrameProgression(ZSTDMT_CCtx *)");
      }
      uVar2 = (pZVar8->src).size;
      local_60 = local_60 + uVar2;
      uVar11 = uVar11 + pZVar8->consumed;
      uVar9 = uVar9 + uVar3;
      uVar7 = uVar7 + uVar6;
      local_68 = local_68 + (pZVar8->consumed < uVar2);
      pthread_mutex_unlock((pthread_mutex_t *)&mtctx->jobs[uVar4].job_mutex);
      uVar10 = uVar10 + 1;
    } while (uVar5 != uVar10);
  }
  else {
    local_68 = 0;
  }
  __return_storage_ptr__->ingested = local_60;
  __return_storage_ptr__->consumed = uVar11;
  __return_storage_ptr__->produced = uVar9;
  __return_storage_ptr__->flushed = uVar7;
  __return_storage_ptr__->nbActiveWorkers = local_68;
  return __return_storage_ptr__;
}

Assistant:

ZSTD_frameProgression ZSTDMT_getFrameProgression(ZSTDMT_CCtx* mtctx)
{
    ZSTD_frameProgression fps;
    DEBUGLOG(5, "ZSTDMT_getFrameProgression");
    fps.ingested = mtctx->consumed + mtctx->inBuff.filled;
    fps.consumed = mtctx->consumed;
    fps.produced = fps.flushed = mtctx->produced;
    fps.currentJobID = mtctx->nextJobID;
    fps.nbActiveWorkers = 0;
    {   unsigned jobNb;
        unsigned lastJobNb = mtctx->nextJobID + mtctx->jobReady; assert(mtctx->jobReady <= 1);
        DEBUGLOG(6, "ZSTDMT_getFrameProgression: jobs: from %u to <%u (jobReady:%u)",
                    mtctx->doneJobID, lastJobNb, mtctx->jobReady)
        for (jobNb = mtctx->doneJobID ; jobNb < lastJobNb ; jobNb++) {
            unsigned const wJobID = jobNb & mtctx->jobIDMask;
            ZSTDMT_jobDescription* jobPtr = &mtctx->jobs[wJobID];
            ZSTD_pthread_mutex_lock(&jobPtr->job_mutex);
            {   size_t const cResult = jobPtr->cSize;
                size_t const produced = ZSTD_isError(cResult) ? 0 : cResult;
                size_t const flushed = ZSTD_isError(cResult) ? 0 : jobPtr->dstFlushed;
                assert(flushed <= produced);
                fps.ingested += jobPtr->src.size;
                fps.consumed += jobPtr->consumed;
                fps.produced += produced;
                fps.flushed  += flushed;
                fps.nbActiveWorkers += (jobPtr->consumed < jobPtr->src.size);
            }
            ZSTD_pthread_mutex_unlock(&mtctx->jobs[wJobID].job_mutex);
        }
    }
    return fps;
}